

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

Node * __thiscall
TMap<int,_PClassActor_*,_THashTraits<int>,_TValueTraits<PClassActor_*>_>::NewKey
          (TMap<int,_PClassActor_*,_THashTraits<int>,_TValueTraits<PClassActor_*>_> *this,int key)

{
  bool bVar1;
  Node *pNVar2;
  Node *n;
  Node *othern;
  Node *mp;
  int key_local;
  TMap<int,_PClassActor_*,_THashTraits<int>,_TValueTraits<PClassActor_*>_> *this_local;
  
  pNVar2 = MainPosition(this,key);
  bVar1 = Node::IsNil(pNVar2);
  if (bVar1) {
    pNVar2->Next = (Node *)0x0;
    othern = pNVar2;
  }
  else {
    othern = GetFreePos(this);
    if (othern == (Node *)0x0) {
      Rehash(this);
      pNVar2 = NewKey(this,key);
      return pNVar2;
    }
    n = MainPosition(this,(pNVar2->Pair).Key);
    if (n == pNVar2) {
      othern->Next = pNVar2->Next;
      pNVar2->Next = othern;
    }
    else {
      for (; n->Next != pNVar2; n = n->Next) {
      }
      n->Next = othern;
      CopyNode(this,othern,pNVar2);
      pNVar2->Next = (Node *)0x0;
      othern = pNVar2;
    }
  }
  this->NumUsed = this->NumUsed + 1;
  (othern->Pair).Key = key;
  return othern;
}

Assistant:

Node *NewKey(const KT key)
	{
		Node *mp = MainPosition(key);
		if (!mp->IsNil())
		{
			Node *othern;
			Node *n = GetFreePos();		/* get a free place */
			if (n == NULL)				/* cannot find a free place? */
			{
				Rehash();				/* grow table */
				return NewKey(key);		/* re-insert key into grown table */
			}
			othern = MainPosition(mp->Pair.Key);
			if (othern != mp)			/* is colliding node out of its main position? */
			{	/* yes; move colliding node into free position */
				while (othern->Next != mp)	/* find previous */
				{
					othern = othern->Next;
				}
				othern->Next = n;		/* redo the chain with 'n' in place of 'mp' */
				CopyNode(n, mp); /* copy colliding node into free pos. (mp->Next also goes) */
				mp->Next = NULL;		/* now 'mp' is free */
			}
			else						/* colliding node is in its own main position */
			{							/* new node will go into free position */
				n->Next = mp->Next;		/* chain new position */
				mp->Next = n;
				mp = n;
			}
		}
		else
		{
			mp->Next = NULL;
		}
		++NumUsed;
		::new(&mp->Pair.Key) KT(key);
		return mp;
	}